

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O2

void __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeTetra>_>::ComputeShape
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeTetra>_> *this,TPZVec<double> *intpoint,
          TPZVec<double> *X,TPZFMatrix<double> *jacobian,TPZFMatrix<double> *axes,REAL *detjac,
          TPZFMatrix<double> *jacinv,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,
          TPZFMatrix<double> *dphix)

{
  TPZGeoEl *this_00;
  ostream *poVar1;
  
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  if (this_00 != (TPZGeoEl *)0x0) {
    TPZGeoEl::Jacobian(this_00,intpoint,jacobian,axes,detjac,jacinv);
    (**(code **)(*(long *)this_00 + 0x228))(this_00,intpoint,X);
    (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapeTetra>).
                           super_TPZIntelGen<pzshape::TPZShapeTetra>.super_TPZInterpolatedElement.
                           super_TPZInterpolationSpace.super_TPZCompEl + 0x278))
              (this,intpoint,phi,dphi);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"\nERROR AT ");
  poVar1 = std::operator<<(poVar1,
                           "virtual void TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeTetra>>::ComputeShape(TPZVec<REAL> &, TPZVec<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &, REAL &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &) [TCOMPEL = TPZCompElH1<pzshape::TPZShapeTetra>]"
                          );
  std::operator<<(poVar1," - this->Reference() == NULL\n");
  return;
}

Assistant:

inline void TPZCompElPostProc<TCOMPEL>::ComputeShape(TPZVec<REAL> &intpoint, TPZVec<REAL> &X,
                                                     TPZFMatrix<REAL> &jacobian, TPZFMatrix<REAL> &axes,
                                                     REAL &detjac, TPZFMatrix<REAL> &jacinv,
                                                     TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi, TPZFMatrix<REAL> &dphix){
    TPZGeoEl * ref = this->Reference();
    if (!ref){
        PZError << "\nERROR AT " << __PRETTY_FUNCTION__ << " - this->Reference() == NULL\n";
        return;
    }//if
    ref->Jacobian( intpoint, jacobian, axes, detjac , jacinv);
    
    ref->X(intpoint, X);
    //  this->Shape(intpoint,intpoint,phi,dphix);
    this->Shape(intpoint,phi,dphi);
    //this->Shape(intpoint,X,phi,dphix);
    
    //    ///axes is identity in discontinuous elements
    //    axes.Resize(dphix.Rows(), dphix.Rows());
    //    axes.Identity();
}